

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_ellswift_xdh(void *arg,int iters)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char **argv;
  int argc;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int in_stack_fffffffffffffe20;
  char **ppcStack_1d8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined1 auStack_178 [72];
  undefined8 uStack_130;
  undefined1 auStack_128 [40];
  undefined8 uStack_100;
  undefined1 auStack_f8 [64];
  undefined1 auStack_b8 [64];
  undefined8 uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  long lStack_60;
  long lStack_58;
  code *pcStack_50;
  int local_44;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uVar6;
  
  if (iters < 1) {
    return;
  }
  lVar10 = (long)arg + 0x4008;
  local_38 = _secp256k1_ellswift_xdh_hash_function_bip324;
  lVar5 = (long)arg + 0x4018;
  uVar8 = 0x10;
  uVar9 = 0;
  lVar11 = lVar10;
  local_44 = iters;
  local_40 = (undefined8 *)arg;
  while( true ) {
    argv = (char **)(lVar11 + (uVar9 / 0x21) * -0x21);
    uVar6 = *local_40;
    pcStack_50 = (code *)0x0;
    lStack_58 = local_38;
    lStack_60 = 0x102f80;
    iVar1 = secp256k1_ellswift_xdh(uVar6,argv,lVar10,lVar10,lVar5 + (uVar8 / 0x21) * -0x21);
    argc = (int)uVar6;
    if (iVar1 != 1) break;
    uVar9 = uVar9 + 1;
    lVar5 = lVar5 + 1;
    uVar8 = uVar8 + 1;
    lVar11 = lVar11 + 1;
    if (local_44 == (int)uVar9) {
      return;
    }
  }
  pcStack_50 = main;
  bench_ellswift_xdh_cold_1();
  uStack_78 = 0xf83e0f83e0f83e1;
  uStack_70 = uVar8;
  uStack_68 = uVar9;
  lStack_60 = lVar10;
  lStack_58 = lVar11;
  pcStack_50 = (code *)lVar5;
  pcVar4 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar4 == (char *)0x0) {
    uVar8 = 20000;
  }
  else {
    uVar8 = strtol(pcVar4,(char **)0x0,0);
  }
  lVar10 = (long)argc;
  if (argc != 1) {
    ppcStack_1d8 = argv + 1;
    do {
      pcVar4 = *ppcStack_1d8;
      lVar5 = 0;
      while( true ) {
        pcVar7 = pcVar4;
        iVar1 = strcmp(pcVar4,*(char **)((long)&PTR_anon_var_dwarf_d5_00107d20 + lVar5));
        iVar3 = (int)pcVar7;
        if (iVar1 == 0) break;
        lVar5 = lVar5 + 8;
        if (lVar5 == 0xa8) goto LAB_0010305e;
      }
      ppcStack_1d8 = ppcStack_1d8 + 1;
    } while (ppcStack_1d8 != argv + lVar10);
LAB_0010305e:
    if (1 < argc) {
      lVar5 = lVar10 * 8;
      lVar11 = 8;
      do {
        pcVar4 = *(char **)((long)argv + lVar11);
        if (((*pcVar4 == '-') && (pcVar4[1] == 'h')) && (pcVar4[2] == '\0')) goto LAB_001030e7;
        lVar11 = lVar11 + 8;
      } while (lVar5 - lVar11 != 0);
      lVar11 = 8;
      do {
        if (lVar5 - lVar11 == 0) {
          lVar11 = 8;
          goto LAB_001030ce;
        }
        pcVar4 = *(char **)((long)argv + lVar11);
        iVar2 = strcmp(pcVar4,"--help");
        iVar3 = (int)pcVar4;
        lVar11 = lVar11 + 8;
      } while (iVar2 != 0);
      goto LAB_001030e7;
    }
  }
LAB_00103103:
  lVar10 = lVar10 * 8;
  lVar5 = 8;
  do {
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_0010313c;
    }
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"recover");
    lVar5 = lVar5 + 8;
  } while (iVar1 != 0);
  goto LAB_00103155;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"ecdsa");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00103297:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_001032bf;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"verify");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_001032bf:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_001032e7;
    }
  }
  goto LAB_00103300;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"sign");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_00103357:
    if (lVar10 == lVar5) {
      lVar5 = 8;
      goto LAB_0010337f;
    }
  }
  goto LAB_00103398;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"ecdsa_sign");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_0010337f:
    if (lVar10 == lVar5) goto LAB_001033ba;
  }
  goto LAB_00103398;
  while( true ) {
    iVar2 = strcmp(*(char **)((long)argv + lVar5),"ec_keygen");
    iVar3 = (int)uVar6;
    lVar5 = lVar5 + 8;
    if (iVar2 == 0) break;
LAB_00103417:
    if (lVar10 == lVar5) goto LAB_00103458;
  }
  goto LAB_00103430;
  while( true ) {
    pcVar4 = *(char **)((long)argv + lVar11);
    iVar2 = strcmp(pcVar4,"help");
    iVar3 = (int)pcVar4;
    lVar11 = lVar11 + 8;
    if (iVar2 == 0) break;
LAB_001030ce:
    if (lVar5 - lVar11 == 0) {
      if (iVar1 != 0) {
        main_cold_1();
        return;
      }
      goto LAB_00103103;
    }
  }
LAB_001030e7:
  help(iVar3);
  return;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar5),"ecdsa_recover");
    lVar5 = lVar5 + 8;
    if (iVar1 == 0) break;
LAB_0010313c:
    if (lVar10 == lVar5) {
      uStack_1c0 = secp256k1_context_create(1);
      uStack_1b8 = 0x807060504030201;
      uStack_1b0 = 0x100f0e0d0c0b0a09;
      uStack_1a8 = 0x1817161514131211;
      uStack_1a0 = 0x201f1e1d1c1b1a19;
      uStack_198 = 0x2827262524232221;
      uStack_190 = 0x302f2e2d2c2b2a29;
      uStack_188 = 0x34333231;
      uStack_184 = 0x38373635;
      uStack_180 = 0x3c3b3a39;
      uStack_17c = 0x403f3e3d;
      uStack_130 = 0x48;
      uVar6 = 0;
      iVar1 = secp256k1_ecdsa_sign(uStack_1c0,auStack_f8,&uStack_1b8,&uStack_198,0);
      if (iVar1 == 0) {
        main_cold_6();
LAB_001034ae:
        main_cold_5();
      }
      else {
        iVar1 = secp256k1_ecdsa_signature_serialize_der
                          (uStack_1c0,auStack_178,&uStack_130,auStack_f8);
        if (iVar1 == 0) goto LAB_001034ae;
        iVar1 = secp256k1_ec_pubkey_create(uStack_1c0,auStack_b8,&uStack_198);
        if (iVar1 != 0) {
          uStack_100 = 0x21;
          iVar1 = secp256k1_ec_pubkey_serialize(uStack_1c0,auStack_128,&uStack_100,auStack_b8,0x102)
          ;
          if (iVar1 != 1) goto LAB_001034b8;
          printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
                 "    Max(us)    ");
          putchar(10);
          iVar1 = (int)uVar8;
          if (argc == 1) goto LAB_00103300;
          lVar5 = 8;
          goto LAB_00103297;
        }
      }
      main_cold_4();
LAB_001034b8:
      main_cold_3();
      puts("Benchmarks the following algorithms:");
      puts("    - ECDSA signing/verification");
      puts("    - ECDH key exchange (optional module)");
      puts("    - Schnorr signatures (optional module)");
      putchar(10);
      printf("The default number of iterations for each benchmark is %d. This can be\n",20000);
      puts("customized using the SECP256K1_BENCH_ITERS environment variable.");
      putchar(10);
      puts("Usage: ./bench [args]");
      puts("By default, all benchmarks will be run.");
      puts("args:");
      puts("    help              : display this help and exit");
      puts("    ecdsa             : all ECDSA algorithms--sign, verify, recovery (if enabled)");
      puts("    ecdsa_sign        : ECDSA siging algorithm");
      puts("    ecdsa_verify      : ECDSA verification algorithm");
      puts("    ec                : all EC public key algorithms (keygen)");
      puts("    ec_keygen         : EC public key generation");
      puts("    ecdh              : ECDH key exchange algorithm");
      puts("    schnorrsig        : all Schnorr signature algorithms (sign, verify)");
      puts("    schnorrsig_sign   : Schnorr sigining algorithm");
      puts("    schnorrsig_verify : Schnorr verification algorithm");
      puts("    ellswift          : all ElligatorSwift benchmarks (encode, decode, keygen, ecdh)");
      puts("    ellswift_encode   : ElligatorSwift encoding");
      puts("    ellswift_decode   : ElligatorSwift decoding");
      puts("    ellswift_keygen   : ElligatorSwift key generation");
      puts("    ellswift_ecdh     : ECDH on ElligatorSwift keys");
      putchar(10);
      return;
    }
  }
LAB_00103155:
  main_cold_2();
  return;
  while( true ) {
    iVar3 = strcmp(*(char **)((long)argv + lVar5),"ecdsa_verify");
    lVar5 = lVar5 + 8;
    if (iVar3 == 0) break;
LAB_001032e7:
    if (lVar10 == lVar5) goto LAB_0010331d;
  }
LAB_00103300:
  run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&uStack_1c0,(void *)(uVar8 & 0xffffffff),(int)uVar6,
                in_stack_fffffffffffffe20);
LAB_0010331d:
  if (argc != 1) {
    lVar5 = 8;
    do {
      if (lVar10 == lVar5) {
        lVar5 = 8;
        goto LAB_00103357;
      }
      iVar3 = strcmp(*(char **)((long)argv + lVar5),"ecdsa");
      lVar5 = lVar5 + 8;
    } while (iVar3 != 0);
  }
LAB_00103398:
  run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&uStack_1c0,
                (void *)(uVar8 & 0xffffffff),(int)uVar6,in_stack_fffffffffffffe20);
LAB_001033ba:
  iVar3 = (int)uVar6;
  if (argc != 1) {
    lVar5 = 8;
    do {
      pcVar4 = *(char **)((long)argv + lVar5);
      if (((*pcVar4 == 'e') && (pcVar4[1] == 'c')) && (pcVar4[2] == '\0')) goto LAB_00103430;
      lVar5 = lVar5 + 8;
    } while (lVar10 != lVar5);
    lVar5 = 8;
    do {
      if (lVar10 == lVar5) {
        lVar5 = 8;
        goto LAB_00103417;
      }
      iVar2 = strcmp(*(char **)((long)argv + lVar5),"keygen");
      iVar3 = (int)uVar6;
      lVar5 = lVar5 + 8;
    } while (iVar2 != 0);
  }
LAB_00103430:
  run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,
                (_func_void_void_ptr_int *)&uStack_1c0,(void *)(uVar8 & 0xffffffff),iVar3,
                in_stack_fffffffffffffe20);
LAB_00103458:
  secp256k1_context_destroy(uStack_1c0);
  run_ecdh_bench(iVar1,argc,argv);
  run_schnorrsig_bench(iVar1,argc,argv);
  run_ellswift_bench(iVar1,argc,argv);
  return;
}

Assistant:

static void bench_ellswift_xdh(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        int party = i & 1;
        CHECK(secp256k1_ellswift_xdh(data->ctx,
                                     data->rnd64 + (i % 33),
                                     data->rnd64,
                                     data->rnd64,
                                     data->rnd64 + ((i + 16) % 33),
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL) == 1);
    }
}